

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_realloc(nghttp2_bufs *bufs,size_t chunk_length)

{
  nghttp2_buf_chain *local_30;
  nghttp2_buf_chain *chain;
  size_t sStack_20;
  int rv;
  size_t chunk_length_local;
  nghttp2_bufs *bufs_local;
  
  if (chunk_length < bufs->offset) {
    bufs_local._4_4_ = -0x1f5;
  }
  else {
    sStack_20 = chunk_length;
    chunk_length_local = (size_t)bufs;
    chain._4_4_ = buf_chain_new(&local_30,chunk_length,bufs->mem);
    bufs_local._4_4_ = chain._4_4_;
    if (chain._4_4_ == 0) {
      nghttp2_bufs_free((nghttp2_bufs *)chunk_length_local);
      *(nghttp2_buf_chain **)chunk_length_local = local_30;
      *(undefined8 *)(chunk_length_local + 8) = *(undefined8 *)chunk_length_local;
      *(long *)(*(long *)(chunk_length_local + 8) + 0x18) =
           *(long *)(chunk_length_local + 0x38) +
           *(long *)(*(long *)(chunk_length_local + 8) + 0x18);
      *(long *)(*(long *)(chunk_length_local + 8) + 0x20) =
           *(long *)(chunk_length_local + 0x38) +
           *(long *)(*(long *)(chunk_length_local + 8) + 0x20);
      *(size_t *)(chunk_length_local + 0x18) = sStack_20;
      *(undefined8 *)(chunk_length_local + 0x28) = 1;
      bufs_local._4_4_ = 0;
    }
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_bufs_realloc(nghttp2_bufs *bufs, size_t chunk_length) {
  int rv;
  nghttp2_buf_chain *chain;

  if (chunk_length < bufs->offset) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = buf_chain_new(&chain, chunk_length, bufs->mem);
  if (rv != 0) {
    return rv;
  }

  nghttp2_bufs_free(bufs);

  bufs->head = chain;
  bufs->cur = bufs->head;

  nghttp2_buf_shift_right(&bufs->cur->buf, bufs->offset);

  bufs->chunk_length = chunk_length;
  bufs->chunk_used = 1;

  return 0;
}